

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

precise_unit __thiscall units::precise_unit::operator/(precise_unit *this,precise_unit *other)

{
  double dVar1;
  double dVar2;
  uint local_54;
  uint local_50;
  uint local_4c;
  unit_data local_2c;
  precise_unit *local_28;
  precise_unit *other_local;
  precise_unit *this_local;
  
  local_28 = other;
  other_local = this;
  dVar1 = multiplier(this);
  dVar2 = multiplier(local_28);
  local_2c = detail::unit_data::operator/(&this->base_units_,&local_28->base_units_);
  if (this->commodity_ == 0) {
    if (local_28->commodity_ == 0) {
      local_4c = 0;
    }
    else {
      local_4c = local_28->commodity_ ^ 0xffffffff;
    }
    local_50 = local_4c;
  }
  else {
    if (local_28->commodity_ == 0) {
      local_54 = this->commodity_;
    }
    else {
      local_54 = this->commodity_ & (local_28->commodity_ ^ 0xffffffff);
    }
    local_50 = local_54;
  }
  precise_unit((precise_unit *)&this_local,dVar1 / dVar2,&local_2c,local_50);
  return _this_local;
}

Assistant:

constexpr precise_unit operator/(const precise_unit& other) const
    {
        return {
            multiplier() / other.multiplier(),
            base_units_ / other.base_units_,
            (commodity_ == 0) ?
                ((other.commodity_ == 0) ? 0 : ~other.commodity_) :
                ((other.commodity_ == 0) ? commodity_ :
                                           commodity_ & (~other.commodity_)),
        };
    }